

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::sendCommand(FederateState *this,ActionMessage *command)

{
  string_view delimiters;
  string_view line;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view str_01;
  string_view str_02;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  string_view str_03;
  string_view str_04;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  string_view quoteChars;
  string_view V;
  string_view V_00;
  string_view trimCharacters;
  string_view level;
  string_view V_01;
  string_view V_02;
  string_view V_03;
  string_view logMessageSource;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  const_reference pvVar4;
  pointer pLVar5;
  size_type sVar6;
  ActionMessage *in_RSI;
  FederateState *in_RDI;
  ActionMessage barrier_1;
  ActionMessage barrier;
  int newLevel;
  ActionMessage response_2;
  ActionMessage response_1;
  ActionMessage response;
  ActionMessage bye;
  string_viewVector res;
  size_type commentLoc;
  string_view cmd;
  ActionMessage *message;
  undefined1 enabled;
  undefined4 uVar7;
  LogManager *in_stack_fffffffffffff5d8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e8;
  action_t in_stack_fffffffffffff5ec;
  undefined4 in_stack_fffffffffffff5f0;
  int in_stack_fffffffffffff5f4;
  undefined7 in_stack_fffffffffffff5f8;
  char in_stack_fffffffffffff5ff;
  undefined4 in_stack_fffffffffffff600;
  GlobalFederateId in_stack_fffffffffffff604;
  undefined4 in_stack_fffffffffffff608;
  int in_stack_fffffffffffff60c;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff610;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff618;
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff628;
  int in_stack_fffffffffffff62c;
  char *in_stack_fffffffffffff630;
  char *in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff773;
  int in_stack_fffffffffffff774;
  FederateState *in_stack_fffffffffffff778;
  string_view in_stack_fffffffffffff780;
  size_t in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  int in_stack_fffffffffffff7b4;
  FederateState *in_stack_fffffffffffff7b8;
  Time in_stack_fffffffffffff7c0;
  format_args in_stack_fffffffffffff830;
  string_view in_stack_fffffffffffff840;
  size_t local_5a8;
  char *local_5a0;
  undefined8 local_598;
  undefined1 local_590 [40];
  BaseType local_568;
  BaseType local_560;
  size_t local_4a8;
  char *local_4a0;
  __sv_type local_498;
  __sv_type local_488;
  BaseType local_474;
  BaseType local_468;
  BaseType local_460;
  size_t local_3a8;
  char *local_3a0;
  __sv_type local_398;
  __sv_type local_388;
  BaseType local_374;
  char *local_370;
  undefined8 local_368;
  undefined1 local_360 [40];
  BaseType local_338;
  BaseType local_330;
  BaseType local_288;
  BaseType local_270;
  BaseType local_268;
  size_t local_1b0;
  char *local_1a8;
  size_t local_190;
  char *local_188;
  undefined4 local_17c;
  undefined8 local_178;
  char *local_170;
  size_t local_158;
  char *local_150;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_148;
  undefined8 local_130;
  char *local_128;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  size_type local_110;
  string_view local_108;
  ActionMessage *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  string *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 *local_a0;
  size_t local_98 [3];
  undefined8 local_80;
  size_t *local_78;
  char *local_70;
  undefined8 local_68;
  size_t *local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  size_t local_30;
  size_t *local_28;
  size_t *local_20;
  undefined8 *local_18;
  size_t local_10;
  size_t *local_8;
  
  local_f8 = in_RSI;
  local_108 = SmallBuffer::to_string((SmallBuffer *)0x4c6168);
  local_110 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff604.gid,in_stack_fffffffffffff600),
                         in_stack_fffffffffffff5ff,
                         CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  if (local_110 != 0xffffffffffffffff) {
    local_120 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                           CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                           (size_type)in_stack_fffffffffffff5e0);
    local_108 = local_120;
  }
  local_130 = 4;
  local_128 = " \t\n\r";
  trimCharacters._M_len._4_4_ = in_stack_fffffffffffff62c;
  trimCharacters._M_len._0_4_ = in_stack_fffffffffffff628;
  trimCharacters._M_str = in_stack_fffffffffffff630;
  gmlc::utilities::string_viewOps::trimString
            ((string_view *)in_stack_fffffffffffff620,trimCharacters);
  local_158 = local_108._M_len;
  local_150 = local_108._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
  local_178 = 3;
  local_170 = "\'\"`";
  message = (ActionMessage *)0x3;
  uVar7 = 0x71452f;
  iVar2 = 0;
  line._M_str._0_4_ = in_stack_fffffffffffff5e8;
  line._M_len = (size_t)in_stack_fffffffffffff5e0;
  line._M_str._4_4_ = in_stack_fffffffffffff5ec;
  delimiters._M_str = (char *)in_stack_fffffffffffff5d8;
  delimiters._M_len = (size_t)"\'\"`";
  quoteChars._M_len._4_4_ = in_stack_fffffffffffff604.gid;
  quoteChars._M_len._0_4_ = in_stack_fffffffffffff600;
  quoteChars._M_str._0_4_ = in_stack_fffffffffffff608;
  quoteChars._M_str._4_4_ = in_stack_fffffffffffff60c;
  gmlc::utilities::string_viewOps::splitlineQuotes(line,delimiters,quoteChars,on);
  bVar1 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)in_stack_fffffffffffff5e0);
  if (bVar1) {
    local_17c = 1;
    goto LAB_004c7836;
  }
  pvVar3 = CLI::std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::operator[](&local_148,0);
  local_190 = pvVar3->_M_len;
  local_188 = pvVar3->_M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
  __x._M_len._7_1_ = in_stack_fffffffffffff5ff;
  __x._M_len._0_7_ = in_stack_fffffffffffff5f8;
  __x._M_str._0_4_ = in_stack_fffffffffffff600;
  __x._M_str._4_4_ = in_stack_fffffffffffff604.gid;
  __y._M_len._4_4_ = in_stack_fffffffffffff5ec;
  __y._M_len._0_4_ = in_stack_fffffffffffff5e8;
  __y._M_str._0_4_ = in_stack_fffffffffffff5f0;
  __y._M_str._4_4_ = in_stack_fffffffffffff5f4;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
LAB_004c63b5:
    if ((in_RDI->mAllowRemoteControl & 1U) == 0) {
      if (in_RDI->mParent != (CommonCore *)0x0) {
        ActionMessage::action(local_f8);
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec);
        local_370 = "log {} does not allow remote termination";
        local_368 = 0x28;
        local_b8 = getIdentifier_abi_cxx11_(in_RDI);
        local_a0 = local_360;
        local_b0 = local_370;
        uStack_a8 = local_368;
        local_c8 = local_370;
        uStack_c0 = local_368;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d8);
        local_38 = &local_d8;
        local_40 = local_e8;
        local_d8 = 0xd;
        local_d0 = local_40;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff840,in_stack_fffffffffffff830);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,uVar7));
        local_330 = (local_f8->source_id).gid;
        local_374 = (BaseType)
                    std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
        local_338 = local_374;
        ActionMessage::getString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffff5d8,iVar2);
        local_388 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,uVar7));
        str._M_len._7_1_ = in_stack_fffffffffffff5ff;
        str._M_len._0_7_ = in_stack_fffffffffffff5f8;
        str._M_str._0_4_ = in_stack_fffffffffffff600;
        str._M_str._4_4_ = in_stack_fffffffffffff604.gid;
        ActionMessage::setString
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec,str);
        getIdentifier_abi_cxx11_(in_RDI);
        local_398 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,uVar7));
        str_00._M_len._7_1_ = in_stack_fffffffffffff5ff;
        str_00._M_len._0_7_ = in_stack_fffffffffffff5f8;
        str_00._M_str._0_4_ = in_stack_fffffffffffff600;
        str_00._M_str._4_4_ = in_stack_fffffffffffff604.gid;
        ActionMessage::setString
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec,str_00);
        BrokerBase::addActionMessage((BrokerBase *)CONCAT44(iVar2,uVar7),message);
        ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
      }
    }
    else if (in_RDI->mParent != (CommonCore *)0x0) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5ec);
      local_288 = (BaseType)std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      local_270 = local_288;
      local_268 = local_288;
      BrokerBase::addActionMessage((BrokerBase *)CONCAT44(iVar2,uVar7),message);
      ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
    }
  }
  else {
    pvVar3 = CLI::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[](&local_148,0);
    local_1b0 = pvVar3->_M_len;
    local_1a8 = pvVar3->_M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
    __x_00._M_len._7_1_ = in_stack_fffffffffffff5ff;
    __x_00._M_len._0_7_ = in_stack_fffffffffffff5f8;
    __x_00._M_str._0_4_ = in_stack_fffffffffffff600;
    __x_00._M_str._4_4_ = in_stack_fffffffffffff604.gid;
    __y_00._M_len._4_4_ = in_stack_fffffffffffff5ec;
    __y_00._M_len._0_4_ = in_stack_fffffffffffff5e8;
    __y_00._M_str._0_4_ = in_stack_fffffffffffff5f0;
    __y_00._M_str._4_4_ = in_stack_fffffffffffff5f4;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) goto LAB_004c63b5;
    pvVar3 = CLI::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[](&local_148,0);
    local_3a8 = pvVar3->_M_len;
    local_3a0 = pvVar3->_M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
    __x_01._M_len._7_1_ = in_stack_fffffffffffff5ff;
    __x_01._M_len._0_7_ = in_stack_fffffffffffff5f8;
    __x_01._M_str._0_4_ = in_stack_fffffffffffff600;
    __x_01._M_str._4_4_ = in_stack_fffffffffffff604.gid;
    __y_01._M_len._4_4_ = in_stack_fffffffffffff5ec;
    __y_01._M_len._0_4_ = in_stack_fffffffffffff5e8;
    __y_01._M_str._0_4_ = in_stack_fffffffffffff5f0;
    __y_01._M_str._4_4_ = in_stack_fffffffffffff5f4;
    bVar1 = std::operator==(__x_01,__y_01);
    if (bVar1) {
      if (in_RDI->mParent != (CommonCore *)0x0) {
        ActionMessage::action(local_f8);
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                   (char (*) [11])CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        local_460 = (local_f8->source_id).gid;
        local_474 = (BaseType)
                    std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
        local_468 = local_474;
        ActionMessage::getString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffff5d8,iVar2);
        local_488 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,uVar7));
        str_01._M_len._7_1_ = in_stack_fffffffffffff5ff;
        str_01._M_len._0_7_ = in_stack_fffffffffffff5f8;
        str_01._M_str._0_4_ = in_stack_fffffffffffff600;
        str_01._M_str._4_4_ = in_stack_fffffffffffff604.gid;
        ActionMessage::setString
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec,str_01);
        getIdentifier_abi_cxx11_(in_RDI);
        local_498 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,uVar7));
        str_02._M_len._7_1_ = in_stack_fffffffffffff5ff;
        str_02._M_len._0_7_ = in_stack_fffffffffffff5f8;
        str_02._M_str._0_4_ = in_stack_fffffffffffff600;
        str_02._M_str._4_4_ = in_stack_fffffffffffff604.gid;
        ActionMessage::setString
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec,str_02);
        BrokerBase::addActionMessage((BrokerBase *)CONCAT44(iVar2,uVar7),message);
        ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
      }
    }
    else {
      pvVar3 = CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&local_148,0);
      local_4a8 = pvVar3->_M_len;
      local_4a0 = pvVar3->_M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
      __x_02._M_len._7_1_ = in_stack_fffffffffffff5ff;
      __x_02._M_len._0_7_ = in_stack_fffffffffffff5f8;
      __x_02._M_str._0_4_ = in_stack_fffffffffffff600;
      __x_02._M_str._4_4_ = in_stack_fffffffffffff604.gid;
      __y_02._M_len._4_4_ = in_stack_fffffffffffff5ec;
      __y_02._M_len._0_4_ = in_stack_fffffffffffff5e8;
      __y_02._M_str._0_4_ = in_stack_fffffffffffff5f0;
      __y_02._M_str._4_4_ = in_stack_fffffffffffff5f4;
      bVar1 = std::operator==(__x_02,__y_02);
      if (bVar1) {
        if (in_RDI->mParent != (CommonCore *)0x0) {
          ActionMessage::action(local_f8);
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5ec);
          local_5a0 = "\"{} unprocessed commands\"";
          local_598 = 0x19;
          local_5a8 = gmlc::containers::
                      BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                      ::size((BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                              *)CONCAT44(in_stack_fffffffffffff604.gid,in_stack_fffffffffffff600));
          local_48 = local_590;
          local_58 = local_5a0;
          local_50 = local_598;
          local_60 = &local_5a8;
          local_70 = local_5a0;
          local_68 = local_598;
          local_28 = local_98;
          local_18 = &local_80;
          local_20 = local_98;
          local_80 = 4;
          local_30 = local_5a8;
          local_10 = local_5a8;
          local_8 = local_28;
          local_98[0] = local_5a8;
          local_78 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff840,in_stack_fffffffffffff830);
          SmallBuffer::operator=
                    ((SmallBuffer *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,uVar7));
          local_560 = (local_f8->source_id).gid;
          local_568 = (BaseType)
                      std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
          ActionMessage::getString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffff5d8,iVar2);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,uVar7));
          str_03._M_len._7_1_ = in_stack_fffffffffffff5ff;
          str_03._M_len._0_7_ = in_stack_fffffffffffff5f8;
          str_03._M_str._0_4_ = in_stack_fffffffffffff600;
          str_03._M_str._4_4_ = in_stack_fffffffffffff604.gid;
          ActionMessage::setString
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5ec,str_03);
          getIdentifier_abi_cxx11_(in_RDI);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,uVar7));
          str_04._M_len._7_1_ = in_stack_fffffffffffff5ff;
          str_04._M_len._0_7_ = in_stack_fffffffffffff5f8;
          str_04._M_str._0_4_ = in_stack_fffffffffffff600;
          str_04._M_str._4_4_ = in_stack_fffffffffffff604.gid;
          ActionMessage::setString
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5ec,str_04);
          BrokerBase::addActionMessage((BrokerBase *)CONCAT44(iVar2,uVar7),message);
          ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
        }
      }
      else {
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[](&local_148,0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
        __x_03._M_len._7_1_ = in_stack_fffffffffffff5ff;
        __x_03._M_len._0_7_ = in_stack_fffffffffffff5f8;
        __x_03._M_str._0_4_ = in_stack_fffffffffffff600;
        __x_03._M_str._4_4_ = in_stack_fffffffffffff604.gid;
        __y_03._M_len._4_4_ = in_stack_fffffffffffff5ec;
        __y_03._M_len._0_4_ = in_stack_fffffffffffff5e8;
        __y_03._M_str._0_4_ = in_stack_fffffffffffff5f0;
        __y_03._M_str._4_4_ = in_stack_fffffffffffff5f4;
        bVar1 = std::operator==(__x_03,__y_03);
        if (bVar1) {
          sVar6 = CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size(&local_148);
          enabled = (undefined1)((ulong)message >> 0x38);
          if (sVar6 < 2) {
            pLVar5 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
                     operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                 *)0x4c6ec3);
            LogManager::getLogBuffer(pLVar5);
            LogBuffer::enable((LogBuffer *)CONCAT44(iVar2,uVar7),(bool)enabled);
          }
          else {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[](&local_148,1);
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
            __x_04._M_len._7_1_ = in_stack_fffffffffffff5ff;
            __x_04._M_len._0_7_ = in_stack_fffffffffffff5f8;
            __x_04._M_str._0_4_ = in_stack_fffffffffffff600;
            __x_04._M_str._4_4_ = in_stack_fffffffffffff604.gid;
            __y_04._M_len._4_4_ = in_stack_fffffffffffff5ec;
            __y_04._M_len._0_4_ = in_stack_fffffffffffff5e8;
            __y_04._M_str._0_4_ = in_stack_fffffffffffff5f0;
            __y_04._M_str._4_4_ = in_stack_fffffffffffff5f4;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              pLVar5 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                       ::operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                     *)0x4c6e05);
              LogManager::getLogBuffer(pLVar5);
              LogBuffer::enable((LogBuffer *)CONCAT44(iVar2,uVar7),(bool)enabled);
            }
            else {
              pLVar5 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                       ::operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                     *)0x4c6e41);
              LogManager::getLogBuffer(pLVar5);
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator[](&local_148,1);
              V._M_str = (char *)in_stack_fffffffffffff618;
              V._M_len = (size_t)in_stack_fffffffffffff610;
              gmlc::utilities::numeric_conversion<unsigned_long>
                        (V,CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
              LogBuffer::resize((LogBuffer *)
                                CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                                CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
            }
          }
        }
        else {
          CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator[](&local_148,0);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
          __x_05._M_len._7_1_ = in_stack_fffffffffffff5ff;
          __x_05._M_len._0_7_ = in_stack_fffffffffffff5f8;
          __x_05._M_str._0_4_ = in_stack_fffffffffffff600;
          __x_05._M_str._4_4_ = in_stack_fffffffffffff604.gid;
          __y_05._M_len._4_4_ = in_stack_fffffffffffff5ec;
          __y_05._M_len._0_4_ = in_stack_fffffffffffff5e8;
          __y_05._M_str._0_4_ = in_stack_fffffffffffff5f0;
          __y_05._M_str._4_4_ = in_stack_fffffffffffff5f4;
          bVar1 = std::operator==(__x_05,__y_05);
          if (bVar1) {
            sVar6 = CLI::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::size(&local_148);
            if (sVar6 < 2) {
              std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
              operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *
                         )0x4c7165);
              pLVar5 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                       ::operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                     *)0x4c7186);
              LogManager::getConsoleLevel(pLVar5);
              LogManager::updateRemote
                        ((LogManager *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8)
                         ,in_stack_fffffffffffff604,in_stack_fffffffffffff5f4);
            }
            else {
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator[](&local_148,1);
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
              __x_06._M_len._7_1_ = in_stack_fffffffffffff5ff;
              __x_06._M_len._0_7_ = in_stack_fffffffffffff5f8;
              __x_06._M_str._0_4_ = in_stack_fffffffffffff600;
              __x_06._M_str._4_4_ = in_stack_fffffffffffff604.gid;
              __y_06._M_len._4_4_ = in_stack_fffffffffffff5ec;
              __y_06._M_len._0_4_ = in_stack_fffffffffffff5e8;
              __y_06._M_str._0_4_ = in_stack_fffffffffffff5f0;
              __y_06._M_str._4_4_ = in_stack_fffffffffffff5f4;
              bVar1 = std::operator==(__x_06,__y_06);
              if (bVar1) {
                std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
                operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                            *)0x4c6fed);
                LogManager::updateRemote
                          ((LogManager *)
                           CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                           in_stack_fffffffffffff604,in_stack_fffffffffffff5f4);
              }
              else {
                pvVar3 = CLI::std::
                         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::operator[](&local_148,1);
                pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   (pvVar3,0);
                iVar2 = isdigit((int)*pvVar4);
                if (iVar2 == 0) {
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::operator[](&local_148,1);
                  level._M_str = in_stack_fffffffffffff638;
                  level._M_len = (size_t)in_stack_fffffffffffff630;
                  logLevelFromString(level);
                }
                else {
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::operator[](&local_148,1);
                  pLVar5 = std::
                           unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                           ::operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                         *)0x4c7081);
                  LogManager::getConsoleLevel(pLVar5);
                  V_00._M_str = (char *)in_stack_fffffffffffff618;
                  V_00._M_len = (size_t)in_stack_fffffffffffff610;
                  gmlc::utilities::numeric_conversion<int>(V_00,in_stack_fffffffffffff60c);
                }
                std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
                operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                            *)0x4c711e);
                LogManager::updateRemote
                          ((LogManager *)
                           CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                           in_stack_fffffffffffff604,in_stack_fffffffffffff5f4);
              }
            }
            std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
            operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
                       0x4c71c1);
            iVar2 = LogManager::getMaxLevel(in_stack_fffffffffffff5d8);
            in_RDI->maxLogLevel = iVar2;
          }
          else {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[](&local_148,0);
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
            __x_07._M_len._7_1_ = in_stack_fffffffffffff5ff;
            __x_07._M_len._0_7_ = in_stack_fffffffffffff5f8;
            __x_07._M_str._0_4_ = in_stack_fffffffffffff600;
            __x_07._M_str._4_4_ = in_stack_fffffffffffff604.gid;
            __y_07._M_len._4_4_ = in_stack_fffffffffffff5ec;
            __y_07._M_len._0_4_ = in_stack_fffffffffffff5e8;
            __y_07._M_str._0_4_ = in_stack_fffffffffffff5f0;
            __y_07._M_str._4_4_ = in_stack_fffffffffffff5f4;
            bVar1 = std::operator==(__x_07,__y_07);
            if (bVar1) {
              setProperty(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4,
                          in_stack_fffffffffffff7c0);
            }
            else {
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator[](&local_148,0);
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
              __x_08._M_len._7_1_ = in_stack_fffffffffffff5ff;
              __x_08._M_len._0_7_ = in_stack_fffffffffffff5f8;
              __x_08._M_str._0_4_ = in_stack_fffffffffffff600;
              __x_08._M_str._4_4_ = in_stack_fffffffffffff604.gid;
              __y_08._M_len._4_4_ = in_stack_fffffffffffff5ec;
              __y_08._M_len._0_4_ = in_stack_fffffffffffff5e8;
              __y_08._M_str._0_4_ = in_stack_fffffffffffff5f0;
              __y_08._M_str._4_4_ = in_stack_fffffffffffff5f4;
              bVar1 = std::operator==(__x_08,__y_08);
              if (bVar1) {
                ActionMessage::getString_abi_cxx11_
                          ((ActionMessage *)in_stack_fffffffffffff5d8,iVar2);
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(iVar2,uVar7));
                SmallBuffer::to_string((SmallBuffer *)0x4c7330);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                           CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                           (size_type)in_stack_fffffffffffff5e0);
                logMessageSource._M_str = in_stack_fffffffffffff798;
                logMessageSource._M_len = in_stack_fffffffffffff790;
                logMessage(in_stack_fffffffffffff778,in_stack_fffffffffffff774,logMessageSource,
                           in_stack_fffffffffffff780,(bool)in_stack_fffffffffffff773);
              }
              else {
                CLI::std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_148,0);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
                __x_09._M_len._7_1_ = in_stack_fffffffffffff5ff;
                __x_09._M_len._0_7_ = in_stack_fffffffffffff5f8;
                __x_09._M_str._0_4_ = in_stack_fffffffffffff600;
                __x_09._M_str._4_4_ = in_stack_fffffffffffff604.gid;
                __y_09._M_len._4_4_ = in_stack_fffffffffffff5ec;
                __y_09._M_len._0_4_ = in_stack_fffffffffffff5e8;
                __y_09._M_str._0_4_ = in_stack_fffffffffffff5f0;
                __y_09._M_str._4_4_ = in_stack_fffffffffffff5f4;
                bVar1 = std::operator==(__x_09,__y_09);
                if ((bVar1) &&
                   (sVar6 = CLI::std::
                            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::size(&local_148), 2 < sVar6)) {
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::operator[](&local_148,1);
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
                  __x_10._M_len._7_1_ = in_stack_fffffffffffff5ff;
                  __x_10._M_len._0_7_ = in_stack_fffffffffffff5f8;
                  __x_10._M_str._0_4_ = in_stack_fffffffffffff600;
                  __x_10._M_str._4_4_ = in_stack_fffffffffffff604.gid;
                  __y_10._M_len._4_4_ = in_stack_fffffffffffff5ec;
                  __y_10._M_len._0_4_ = in_stack_fffffffffffff5e8;
                  __y_10._M_str._0_4_ = in_stack_fffffffffffff5f0;
                  __y_10._M_str._4_4_ = in_stack_fffffffffffff5f4;
                  bVar1 = std::operator==(__x_10,__y_10);
                  if (bVar1) {
                    ActionMessage::ActionMessage
                              ((ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                               in_stack_fffffffffffff5ec);
                    std::atomic::operator_cast_to_GlobalFederateId
                              ((atomic<helics::GlobalFederateId> *)message);
                    CLI::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::operator[](&local_148,2);
                    V_01._M_str = in_stack_fffffffffffff638;
                    V_01._M_len = (size_t)in_stack_fffffffffffff630;
                    gmlc::utilities::numeric_conversionComplete<double>
                              (V_01,(double)CONCAT44(in_stack_fffffffffffff62c,
                                                     in_stack_fffffffffffff628));
                    TimeRepresentation<count_time<9,_long>_>::operator=
                              ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(iVar2,uVar7),
                               (double)message);
                    sVar6 = CLI::std::
                            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::size(&local_148);
                    if (3 < sVar6) {
                      CLI::std::
                      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::operator[](&local_148,3);
                      V_02._M_str = in_stack_fffffffffffff638;
                      V_02._M_len = (size_t)in_stack_fffffffffffff630;
                      gmlc::utilities::numeric_conversionComplete<int>
                                (V_02,in_stack_fffffffffffff62c);
                    }
                    gmlc::containers::
                    BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
                    push<helics::ActionMessage&>
                              (in_stack_fffffffffffff610,
                               (ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                    ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
                    goto LAB_004c782b;
                  }
                }
                CLI::std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_148,0);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
                __x_11._M_len._7_1_ = in_stack_fffffffffffff5ff;
                __x_11._M_len._0_7_ = in_stack_fffffffffffff5f8;
                __x_11._M_str._0_4_ = in_stack_fffffffffffff600;
                __x_11._M_str._4_4_ = in_stack_fffffffffffff604.gid;
                __y_11._M_len._4_4_ = in_stack_fffffffffffff5ec;
                __y_11._M_len._0_4_ = in_stack_fffffffffffff5e8;
                __y_11._M_str._0_4_ = in_stack_fffffffffffff5f0;
                __y_11._M_str._4_4_ = in_stack_fffffffffffff5f4;
                bVar1 = std::operator==(__x_11,__y_11);
                if ((bVar1) &&
                   (sVar6 = CLI::std::
                            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::size(&local_148), 1 < sVar6)) {
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::operator[](&local_148,1);
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
                  __x_12._M_len._7_1_ = in_stack_fffffffffffff5ff;
                  __x_12._M_len._0_7_ = in_stack_fffffffffffff5f8;
                  __x_12._M_str._0_4_ = in_stack_fffffffffffff600;
                  __x_12._M_str._4_4_ = in_stack_fffffffffffff604.gid;
                  __y_12._M_len._4_4_ = in_stack_fffffffffffff5ec;
                  __y_12._M_len._0_4_ = in_stack_fffffffffffff5e8;
                  __y_12._M_str._0_4_ = in_stack_fffffffffffff5f0;
                  __y_12._M_str._4_4_ = in_stack_fffffffffffff5f4;
                  bVar1 = std::operator==(__x_12,__y_12);
                  if (bVar1) {
                    ActionMessage::ActionMessage
                              ((ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                               in_stack_fffffffffffff5ec);
                    std::atomic::operator_cast_to_GlobalFederateId
                              ((atomic<helics::GlobalFederateId> *)message);
                    sVar6 = CLI::std::
                            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::size(&local_148);
                    if (2 < sVar6) {
                      CLI::std::
                      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::operator[](&local_148,2);
                      V_03._M_str = in_stack_fffffffffffff638;
                      V_03._M_len = (size_t)in_stack_fffffffffffff630;
                      gmlc::utilities::numeric_conversionComplete<int>
                                (V_03,in_stack_fffffffffffff62c);
                    }
                    gmlc::containers::
                    BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
                    push<helics::ActionMessage&>
                              (in_stack_fffffffffffff610,
                               (ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                    ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(iVar2,uVar7));
                    goto LAB_004c782b;
                  }
                }
                in_stack_fffffffffffff5e0 =
                     (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->commandQueue;
                ActionMessage::getString_abi_cxx11_
                          ((ActionMessage *)in_stack_fffffffffffff5d8,iVar2);
                gmlc::containers::
                BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
                ::
                emplace<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&>
                          (in_stack_fffffffffffff620,in_stack_fffffffffffff618,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff610);
              }
            }
          }
        }
      }
    }
  }
LAB_004c782b:
  local_17c = 0;
LAB_004c7836:
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffff5e0);
  return;
}

Assistant:

void FederateState::sendCommand(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " ",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return;
    }

    if (res[0] == "terminate" || res[0] == "halt") {
        if (mAllowRemoteControl) {
            if (mParent != nullptr) {
                ActionMessage bye(CMD_DISCONNECT);
                bye.source_id = global_id.load();
                bye.dest_id = bye.source_id;
                mParent->addActionMessage(bye);
            }
        } else {
            if (mParent != nullptr) {
                ActionMessage response(command.action());
                response.payload =
                    fmt::format("log {} does not allow remote termination", getIdentifier());
                response.dest_id = command.source_id;
                response.source_id = global_id.load();
                response.setString(targetStringLoc, command.getString(sourceStringLoc));
                response.setString(sourceStringLoc, getIdentifier());

                mParent->addActionMessage(std::move(response));
            }
        }
    } else if (res[0] == "echo") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = "echo_reply";
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "command_status") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = fmt::format("\"{} unprocessed commands\"", commandQueue.size());
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLevel{HELICS_LOG_LEVEL_NO_PRINT};
                if (isdigit(res[1][0]) != 0) {
                    newLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1],
                                                                 mLogManager->getConsoleLevel());
                } else {
                    newLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel = mLogManager->getMaxLevel();
    } else if (res[0] == "timeout_monitor") {
        setProperty(defs::Properties::GRANT_TIMEOUT, command.actionTime);
    } else if (res[0] == "log") {
        logMessage(HELICS_LOG_LEVEL_SUMMARY,
                   command.getString(sourceStringLoc),
                   command.payload.to_string().substr(4));
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.dest_id = global_id;
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        queue.push(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        barrier.dest_id = global_id;
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        queue.push(barrier);
    } else {
        commandQueue.emplace(cmd, command.getString(sourceStringLoc));
    }
}